

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_negx(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  int opsize;
  TCGv_i32 pTVar1;
  TCGv_i32 ah;
  undefined6 in_register_00000012;
  uintptr_t o;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn_opsize((int)CONCAT62(in_register_00000012,insn));
  pTVar1 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    gen_flush_flags(s);
    ah = tcg_const_i32_m68k(tcg_ctx,0);
    tcg_gen_add2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,pTVar1,ah,QREG_CC_X,ah);
    tcg_gen_sub2_i32_m68k(tcg_ctx,QREG_CC_N,QREG_CC_X,ah,ah,QREG_CC_N,QREG_CC_X);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ah + (long)tcg_ctx));
    gen_ext(tcg_ctx,QREG_CC_N,QREG_CC_N,opsize,1);
    tcg_gen_andi_i32_m68k(tcg_ctx,QREG_CC_X,QREG_CC_X,1);
    tcg_gen_and_i32(tcg_ctx,QREG_CC_V,QREG_CC_N,pTVar1);
    tcg_gen_or_i32(tcg_ctx,QREG_CC_Z,QREG_CC_Z,QREG_CC_N);
    tcg_gen_mov_i32(tcg_ctx,QREG_CC_C,QREG_CC_X);
    set_cc_op(s,CC_OP_FLAGS);
    pTVar1 = gen_ea(env,s,insn,opsize,QREG_CC_N,&addr,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(negx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv z;
    TCGv src;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src, opsize, 1, &addr);

    gen_flush_flags(s); /* compute old Z */

    /*
     * Perform substract with borrow.
     * (X, N) =  -(src + X);
     */

    z = tcg_const_i32(tcg_ctx, 0);
    tcg_gen_add2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, src, z, QREG_CC_X, z);
    tcg_gen_sub2_i32(tcg_ctx, QREG_CC_N, QREG_CC_X, z, z, QREG_CC_N, QREG_CC_X);
    tcg_temp_free(tcg_ctx, z);
    gen_ext(tcg_ctx, QREG_CC_N, QREG_CC_N, opsize, 1);

    tcg_gen_andi_i32(tcg_ctx, QREG_CC_X, QREG_CC_X, 1);

    /*
     * Compute signed-overflow for negation.  The normal formula for
     * subtraction is (res ^ src) & (src ^ dest), but with dest==0
     * this simplies to res & src.
     */

    tcg_gen_and_i32(tcg_ctx, QREG_CC_V, QREG_CC_N, src);

    /* Copy the rest of the results into place.  */
    tcg_gen_or_i32(tcg_ctx, QREG_CC_Z, QREG_CC_Z, QREG_CC_N); /* !Z is sticky */
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, QREG_CC_X);

    set_cc_op(s, CC_OP_FLAGS);

    /* result is in QREG_CC_N */

    DEST_EA(env, insn, opsize, QREG_CC_N, &addr);
}